

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTreeClauseVariantIndex::insert
          (SubstitutionTreeClauseVariantIndex *this,Clause *cl)

{
  ZIArray<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*> *this_00;
  ClauseList *pCVar1;
  List<Kernel::Clause_*> *pLVar2;
  uint uVar3;
  ClauseList *pCVar4;
  LiteralSubstitutionTree<Indexing::LiteralClause> *pLVar5;
  Literal *pLVar6;
  List<Kernel::Clause_*> *pLVar7;
  uint length;
  SubstitutionTreeClauseVariantIndex *this_01;
  uint uVar8;
  ulong n;
  ClauseList **plist;
  List<Kernel::Clause_*> *local_40;
  List<Kernel::Clause_*> **local_38;
  
  uVar8 = (uint)*(ulong *)&cl->field_0x38;
  length = uVar8 & 0xfffff;
  if (length == 1) {
    this_01 = (SubstitutionTreeClauseVariantIndex *)cl->_literals[0];
    uVar3 = Kernel::Term::numVarOccs((Term *)this_01);
    if (uVar3 != 0) goto LAB_002c18cd;
    local_40 = (List<Kernel::Clause_*> *)0x0;
    ::Lib::
    DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
    getValuePtr(&this->_groundUnits,cl->_literals[0],&local_38,&local_40);
    pLVar2 = *local_38;
    pLVar7 = (List<Kernel::Clause_*> *)
             ::Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pLVar7->_head = cl;
    pLVar7->_tail = pLVar2;
    *local_38 = pLVar7;
  }
  else {
    this_01 = this;
    if ((*(ulong *)&cl->field_0x38 & 0xfffff) != 0) {
LAB_002c18cd:
      this_00 = &this->_strees;
      n = (ulong)(uVar8 & 0xfffff);
      if ((this->_strees).super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>.
          _capacity <= n) {
        this_01 = (SubstitutionTreeClauseVariantIndex *)this_00;
        ::Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::expandToFit
                  (&this_00->
                    super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>,n);
      }
      if ((this->_strees).super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>.
          _array[n] == (LiteralSubstitutionTree<Indexing::LiteralClause> *)0x0) {
        pLVar5 = (LiteralSubstitutionTree<Indexing::LiteralClause> *)::operator_new(0x28);
        (pLVar5->super_LiteralIndexingStructure<Indexing::LiteralClause>).
        _vptr_LiteralIndexingStructure = (_func_int **)&PTR__LiteralSubstitutionTree_00b53d78;
        this_01 = (SubstitutionTreeClauseVariantIndex *)&pLVar5->_trees;
        ::Lib::
        Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>_>
        ::Stack((Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>_>
                 *)this_01,
                (ulong)((uint)((ulong)(*(long *)(DAT_00b7e1b0 + 0x88) -
                                      *(long *)(DAT_00b7e1b0 + 0x80)) >> 2) & 0xfffffffe));
        if ((this->_strees).
            super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>._capacity <= n
           ) {
          this_01 = (SubstitutionTreeClauseVariantIndex *)this_00;
          ::Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::expandToFit
                    (&this_00->
                      super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>,n);
        }
        (this->_strees).super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>.
        _array[n] = pLVar5;
      }
      pLVar6 = getMainLiteral(this_01,cl->_literals,length);
      if ((this->_strees).super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>.
          _capacity <= n) {
        ::Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::expandToFit
                  (&this_00->
                    super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>,n);
      }
      pLVar5 = (this->_strees).
               super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>._array[n];
      (*(pLVar5->super_LiteralIndexingStructure<Indexing::LiteralClause>).
        _vptr_LiteralIndexingStructure[2])(pLVar5,pLVar6,cl,1);
      return;
    }
    pCVar1 = this->_emptyClauses;
    pCVar4 = (ClauseList *)
             ::Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pCVar4->_head = cl;
    pCVar4->_tail = pCVar1;
    this->_emptyClauses = pCVar4;
  }
  return;
}

Assistant:

void SubstitutionTreeClauseVariantIndex::insert(Clause* cl)
{
  unsigned clen=cl->length();

  if(cl->length()==0) {
    ClauseList::push(cl, _emptyClauses);
    return;
  }
  if(cl->length()==1 && (*cl)[0]->ground()) {
    Literal* lit=(*cl)[0];
    ClauseList** plist;
    _groundUnits.getValuePtr(lit, plist,0);
    ClauseList::push(cl, *plist);
    return;
  }

  if(!_strees[clen]) {
    _strees[clen] = new LiteralSubstitutionTree();
  }
  Literal* mainLit=getMainLiteral(cl->literals(), clen);
  _strees[clen]->insert(LiteralClause{ mainLit, cl });
}